

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::writeEncodedText(XmlWriter *this,string *text)

{
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_90 [48];
  string local_60 [32];
  long local_40;
  size_type pos;
  string mtext;
  string *text_local;
  XmlWriter *this_local;
  
  std::__cxx11::string::string((string *)&pos,(string *)text);
  local_40 = std::__cxx11::string::find_first_of
                       ((char *)&pos,(ulong)writeEncodedText::charsToEncode);
  while (local_40 != -1) {
    poVar2 = stream(this);
    std::__cxx11::string::substr((ulong)local_60,(ulong)&pos);
    std::operator<<(poVar2,local_60);
    std::__cxx11::string::~string(local_60);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&pos);
    cVar1 = *pcVar3;
    if (cVar1 == '\"') {
      poVar2 = stream(this);
      std::operator<<(poVar2,"&quot;");
    }
    else if (cVar1 == '&') {
      poVar2 = stream(this);
      std::operator<<(poVar2,"&amp;");
    }
    else if (cVar1 == '<') {
      poVar2 = stream(this);
      std::operator<<(poVar2,"&lt;");
    }
    std::__cxx11::string::substr((ulong)local_90,(ulong)&pos);
    std::__cxx11::string::operator=((string *)&pos,local_90);
    std::__cxx11::string::~string(local_90);
    local_40 = std::__cxx11::string::find_first_of
                         ((char *)&pos,(ulong)writeEncodedText::charsToEncode);
  }
  poVar2 = stream(this);
  std::operator<<(poVar2,(string *)&pos);
  std::__cxx11::string::~string((string *)&pos);
  return;
}

Assistant:

void writeEncodedText( std::string const& text ) {
            static const char* charsToEncode = "<&\"";
            std::string mtext = text;
            std::string::size_type pos = mtext.find_first_of( charsToEncode );
            while( pos != std::string::npos ) {
                stream() << mtext.substr( 0, pos );

                switch( mtext[pos] ) {
                    case '<':
                        stream() << "&lt;";
                        break;
                    case '&':
                        stream() << "&amp;";
                        break;
                    case '\"':
                        stream() << "&quot;";
                        break;
                }
                mtext = mtext.substr( pos+1 );
                pos = mtext.find_first_of( charsToEncode );
            }
            stream() << mtext;
        }